

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdsDevice.cpp
# Opt level: O1

DeviceInfo * __thiscall AdsDevice::GetDeviceInfo(DeviceInfo *__return_storage_ptr__,AdsDevice *this)

{
  long adsErrorCode;
  AdsException *this_00;
  
  adsErrorCode = AdsSyncReadDeviceInfoReqEx
                           (*(this->m_LocalPort)._M_t.
                             super___uniq_ptr_impl<const_long,_ResourceDeleter<const_long>_>._M_t.
                             super__Tuple_impl<0UL,_const_long_*,_ResourceDeleter<const_long>_>.
                             super__Head_base<0UL,_const_long_*,_false>._M_head_impl,&this->m_Addr,
                            __return_storage_ptr__->name,&__return_storage_ptr__->version);
  if (adsErrorCode == 0) {
    return __return_storage_ptr__;
  }
  this_00 = (AdsException *)__cxa_allocate_exception(0x30);
  AdsException::AdsException(this_00,adsErrorCode);
  __cxa_throw(this_00,&AdsException::typeinfo,AdsException::~AdsException);
}

Assistant:

DeviceInfo AdsDevice::GetDeviceInfo() const
{
    DeviceInfo info;
    auto error = AdsSyncReadDeviceInfoReqEx(GetLocalPort(),
                                            &m_Addr,
                                            &info.name[0],
                                            &info.version);

    if (error) {
        throw AdsException(error);
    }
    return info;
}